

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.h
# Opt level: O0

NBestEncodeResult * __thiscall
sentencepiece::ModelInterface::NBestEncode
          (ModelInterface *this,string_view normalized,int nbest_size)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  NBestEncodeResult *in_RDI;
  char *in_stack_ffffffffffffff68;
  Die local_25 [37];
  
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 3) {
    error::Die::Die(local_25,false);
    pcVar2 = logging::BaseName(in_stack_ffffffffffffff68);
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x57);
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"LOG(");
    poVar3 = std::operator<<(poVar3,"ERROR");
    poVar3 = std::operator<<(poVar3,") ");
    poVar3 = std::operator<<(poVar3,"Not implemented.");
    error::Die::operator&(local_25,poVar3);
    error::Die::~Die((Die *)poVar3);
  }
  memset(in_RDI,0,0x18);
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
            *)0x46eefd);
  return in_RDI;
}

Assistant:

virtual NBestEncodeResult NBestEncode(absl::string_view normalized,
                                        int nbest_size) const {
    LOG(ERROR) << "Not implemented.";
    return NBestEncodeResult();
  }